

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSizeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureSizeTests::init(TextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  TestContext *pTVar3;
  RenderContext *pRVar4;
  TestNode *pTVar5;
  ostream *poVar6;
  Texture2DSizeCase *this_00;
  long lVar7;
  undefined8 extraout_RAX;
  undefined8 uVar8;
  TextureCubeSizeCase *this_01;
  long lVar9;
  int iVar10;
  bool *pbVar11;
  int local_204;
  char *local_1c8 [4];
  ostringstream name;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Size Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
    uVar1 = (&DAT_01841ce0)[lVar9 * 2];
    uVar2 = (&DAT_01841ce4)[lVar9 * 2];
    local_204 = 1;
    if ((uVar1 & uVar1 - 1) == 0) {
      local_204 = ((uVar2 - 1 & uVar2) == 0) + 1;
    }
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      iVar10 = 0;
      while( true ) {
        pbVar11 = glcts::fixed_sample_locations_values + 1;
        if (local_204 == iVar10) break;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&name,uVar1);
        poVar6 = std::operator<<(poVar6,"x");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
        poVar6 = std::operator<<(poVar6,"_");
        poVar6 = std::operator<<(poVar6,(char *)(&DAT_01e26600)[lVar7 * 2]);
        if (iVar10 != 0) {
          pbVar11 = (bool *)0x17fa44c;
        }
        std::operator<<(poVar6,pbVar11);
        this_00 = (Texture2DSizeCase *)operator_new(0xf0);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
        std::__cxx11::stringbuf::str();
        Texture2DSizeCase::Texture2DSizeCase
                  (this_00,pTVar3,pRVar4,local_1c8[0],glcts::fixed_sample_locations_values + 1,
                   (&DAT_01e26608)[lVar7 * 4],(&DAT_01e2660c)[lVar7 * 4],uVar1,uVar2,iVar10 != 0);
        tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        iVar10 = iVar10 + 1;
      }
    }
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cubemap Texture Size Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  uVar8 = extraout_RAX;
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
    uVar1 = (&DAT_01841d10)[lVar9 * 2];
    uVar2 = (&DAT_01841d14)[lVar9 * 2];
    local_204 = 1;
    if ((uVar1 & uVar1 - 1) == 0) {
      local_204 = ((uVar2 - 1 & uVar2) == 0) + 1;
    }
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      iVar10 = 0;
      while( true ) {
        pbVar11 = glcts::fixed_sample_locations_values + 1;
        if (local_204 == iVar10) break;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&name,uVar1);
        poVar6 = std::operator<<(poVar6,"x");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
        poVar6 = std::operator<<(poVar6,"_");
        poVar6 = std::operator<<(poVar6,(char *)(&DAT_01e26600)[lVar7 * 2]);
        if (iVar10 != 0) {
          pbVar11 = (bool *)0x17fa44c;
        }
        std::operator<<(poVar6,pbVar11);
        this_01 = (TextureCubeSizeCase *)operator_new(0xf8);
        pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
        std::__cxx11::stringbuf::str();
        TextureCubeSizeCase::TextureCubeSizeCase
                  (this_01,pTVar3,pRVar4,local_1c8[0],glcts::fixed_sample_locations_values + 1,
                   (&DAT_01e26608)[lVar7 * 4],(&DAT_01e2660c)[lVar7 * 4],uVar1,uVar2,iVar10 != 0);
        tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        iVar10 = iVar10 + 1;
      }
    }
    uVar8 = 4;
  }
  return (int)uVar8;
}

Assistant:

void TextureSizeTests::init (void)
{
	struct
	{
		int	width;
		int	height;
	} sizes2D[] =
	{
		{   64,   64 }, // Spec-mandated minimum.
		{   65,   63 },
		{  512,  512 },
		{ 1024, 1024 },
		{ 2048, 2048 }
	};

	struct
	{
		int	width;
		int	height;
	} sizesCube[] =
	{
		{  15,  15 },
		{  16,  16 }, // Spec-mandated minimum
		{  64,  64 },
		{ 128, 128 },
		{ 256, 256 },
		{ 512, 512 }
	};

	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} formats[] =
	{
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	// 2D cases.
	tcu::TestCaseGroup* group2D = new tcu::TestCaseGroup(m_testCtx, "2d", "2D Texture Size Tests");
	addChild(group2D);
	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes2D); sizeNdx++)
	{
		int		width	= sizes2D[sizeNdx].width;
		int		height	= sizes2D[sizeNdx].height;
		bool	isPOT	= deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			for (int mipmap = 0; mipmap < (isPOT ? 2 : 1); mipmap++)
			{
				std::ostringstream name;
				name << width << "x" << height << "_" << formats[formatNdx].name << (mipmap ? "_mipmap" : "");

				group2D->addChild(new Texture2DSizeCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
														formats[formatNdx].format, formats[formatNdx].dataType,
														width, height, mipmap != 0));
			}
		}
	}

	// Cubemap cases.
	tcu::TestCaseGroup* groupCube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap Texture Size Tests");
	addChild(groupCube);
	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizesCube); sizeNdx++)
	{
		int		width	= sizesCube[sizeNdx].width;
		int		height	= sizesCube[sizeNdx].height;
		bool	isPOT	= deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			for (int mipmap = 0; mipmap < (isPOT ? 2 : 1); mipmap++)
			{
				std::ostringstream name;
				name << width << "x" << height << "_" << formats[formatNdx].name << (mipmap ? "_mipmap" : "");

				groupCube->addChild(new TextureCubeSizeCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
															formats[formatNdx].format, formats[formatNdx].dataType,
															width, height, mipmap != 0));
			}
		}
	}
}